

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_CreateProperty(JSContext *ctx,JSObject *p,JSAtom prop,JSValue val,JSValue getter,
                     JSValue setter,int flags)

{
  JSClassExoticMethods *pJVar1;
  JSValue obj;
  JSValue val_00;
  JSValue JVar2;
  JSValue new_val;
  JSValue val_01;
  JSValue JVar3;
  JSValue v_00;
  JSValue JVar4;
  JSValue v_01;
  JSValue val_02;
  JSValue v_02;
  JSValue val_03;
  JSValue v_03;
  BOOL BVar5;
  int iVar6;
  JSShapeProperty *pJVar7;
  JSValueUnion *pJVar8;
  JSValueUnion in_RCX;
  JSAtom in_EDX;
  JSValueUnion in_RSI;
  JSContext *in_RDI;
  int64_t in_R8;
  uint in_R9D;
  JSValue JVar9;
  undefined8 in_stack_00000008;
  undefined4 in_stack_00000010;
  undefined4 in_stack_00000014;
  undefined8 in_stack_00000018;
  undefined4 in_stack_00000020;
  undefined4 in_stack_00000024;
  JSClassExoticMethods *em;
  JSShapeProperty *pslen;
  JSProperty *plen;
  uint32_t len;
  uint32_t idx;
  int prop_flags;
  int ret;
  JSProperty *pr;
  JSValue v;
  JSContext *in_stack_fffffffffffffe48;
  JSAtom in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe54;
  int in_stack_fffffffffffffe58;
  JSAtom in_stack_fffffffffffffe5c;
  undefined4 in_stack_fffffffffffffe60;
  JSAtom in_stack_fffffffffffffe64;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  JSContext *in_stack_fffffffffffffe70;
  JSValueUnion in_stack_fffffffffffffe78;
  JSObject *in_stack_fffffffffffffe80;
  JSContext *in_stack_fffffffffffffe88;
  uint uStack_14c;
  JSValueUnion local_140;
  JSValueUnion local_138;
  JSValueUnion local_130;
  JSValueUnion local_120;
  uint local_b8;
  uint32_t local_b4;
  
  if ((*(byte *)((long)in_RSI.ptr + 5) >> 2 & 1) != 0) {
    if (*(short *)((long)in_RSI.ptr + 6) == 2) {
      if ((*(byte *)((long)in_RSI.ptr + 5) >> 3 & 1) == 0) {
        BVar5 = JS_AtomIsArrayIndex((JSContext *)
                                    CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                                    (uint32_t *)
                                    CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                                    in_stack_fffffffffffffe5c);
        if (BVar5 == 0) goto LAB_0012fd6a;
      }
      else {
        BVar5 = __JS_AtomIsTaggedInt(in_EDX);
        if (BVar5 == 0) {
          BVar5 = JS_AtomIsArrayIndex((JSContext *)
                                      CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                                      (uint32_t *)
                                      CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                                      in_stack_fffffffffffffe5c);
          if (BVar5 == 0) goto LAB_0012fd6a;
        }
        else {
          local_b4 = __JS_AtomToUInt32(in_EDX);
          if (local_b4 == *(uint32_t *)((long)in_RSI.ptr + 0x40)) {
            if ((*(byte *)((long)in_RSI.ptr + 5) & 1) == 0) goto LAB_0012fd7d;
            if (((in_R9D & 0x1800) == 0) && (iVar6 = get_prop_flags(in_R9D,0), iVar6 == 7)) {
              v_00.tag = in_R8;
              v_00.u.ptr = in_RCX.ptr;
              JS_DupValue(in_RDI,v_00);
              val_01.tag = (int64_t)in_stack_fffffffffffffe80;
              val_01.u.float64 = in_stack_fffffffffffffe78.float64;
              iVar6 = add_fast_array_element
                                (in_stack_fffffffffffffe70,
                                 (JSObject *)
                                 CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                                 val_01,in_stack_fffffffffffffe64);
              return iVar6;
            }
          }
        }
        iVar6 = convert_fast_array_to_array(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
        if (iVar6 != 0) {
          return -1;
        }
      }
      val_00.u._4_4_ = in_stack_fffffffffffffe5c;
      val_00.u.int32 = in_stack_fffffffffffffe58;
      val_00.tag._0_4_ = in_stack_fffffffffffffe60;
      val_00.tag._4_4_ = in_stack_fffffffffffffe64;
      JS_ToUint32((JSContext *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                  (uint32_t *)in_stack_fffffffffffffe48,val_00);
      if (local_b8 < local_b4 + 1) {
        pJVar7 = get_shape_prop(*(JSShape **)((long)in_RSI.ptr + 0x18));
        if ((*(uint *)pJVar7 >> 0x1a & 2) == 0) {
          iVar6 = JS_ThrowTypeErrorReadOnly
                            ((JSContext *)
                             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                             in_stack_fffffffffffffe54,in_stack_fffffffffffffe50);
          return iVar6;
        }
        if (0x7fffffff < local_b4 + 1) {
          __JS_NewFloat64(in_RDI,(double)(local_b4 + 1));
        }
        new_val.u._4_4_ = in_stack_fffffffffffffe6c;
        new_val.u.int32 = in_stack_fffffffffffffe68;
        new_val.tag = (int64_t)in_stack_fffffffffffffe70;
        set_value((JSContext *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                  (JSValue *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),new_val);
      }
    }
    else if ((*(ushort *)((long)in_RSI.ptr + 6) < 0x15) ||
            (0x1d < *(ushort *)((long)in_RSI.ptr + 6))) {
      if (((in_R9D & 0x20000) == 0) &&
         (pJVar1 = in_RDI->rt->class_array[*(ushort *)((long)in_RSI.ptr + 6)].exotic,
         pJVar1 != (JSClassExoticMethods *)0x0)) {
        if (pJVar1->define_own_property !=
            (_func_int_JSContext_ptr_JSValue_JSAtom_JSValue_JSValue_JSValue_int *)0x0) {
          JVar3.tag = -1;
          JVar3.u.ptr = in_RSI.ptr;
          JVar4.tag = in_R8;
          JVar4.u.ptr = in_RCX.ptr;
          JVar9.tag._0_4_ = in_stack_00000010;
          JVar9.u.ptr = (void *)in_stack_00000008;
          JVar2.tag._0_4_ = in_stack_00000020;
          JVar2.u.ptr = (void *)in_stack_00000018;
          JVar9.tag._4_4_ = in_stack_00000014;
          JVar2.tag._4_4_ = in_stack_00000024;
          iVar6 = (*pJVar1->define_own_property)(in_RDI,JVar3,in_EDX,JVar4,JVar9,JVar2,in_R9D);
          return iVar6;
        }
        obj.u._4_4_ = in_stack_fffffffffffffe54;
        obj.u.int32 = in_stack_fffffffffffffe50;
        obj.tag._0_4_ = in_stack_fffffffffffffe58;
        obj.tag._4_4_ = in_stack_fffffffffffffe5c;
        iVar6 = JS_IsExtensible(in_stack_fffffffffffffe48,obj);
        if (iVar6 < 0) {
          return -1;
        }
        if (iVar6 == 0) goto LAB_0012fd7d;
      }
    }
    else {
      iVar6 = JS_AtomIsNumericIndex
                        ((JSContext *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                         in_stack_fffffffffffffe64);
      if (iVar6 != 0) {
        if (iVar6 < 0) {
          return -1;
        }
        iVar6 = JS_ThrowTypeErrorOrFalse
                          (in_RDI,(int)(ulong)in_R9D,"cannot create numeric index in typed array");
        return iVar6;
      }
    }
  }
LAB_0012fd6a:
  if ((*(byte *)((long)in_RSI.ptr + 5) & 1) != 0) {
    pJVar8 = (JSValueUnion *)
             add_property((JSContext *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)
                          ,(JSObject *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60)
                          ,in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58);
    if (pJVar8 == (JSValueUnion *)0x0) {
      return -1;
    }
    if ((in_R9D & 0x1800) == 0) {
      if ((in_R9D & 0x2000) == 0) {
        pJVar8->ptr = (void *)((ulong)uStack_14c << 0x20);
        pJVar8[1].float64 = 1.48219693752374e-323;
      }
      else {
        v_01.tag = in_R8;
        v_01.u.ptr = in_RCX.ptr;
        JVar9 = JS_DupValue(in_RDI,v_01);
        local_140 = JVar9.u;
        *pJVar8 = local_140;
        local_138 = (JSValueUnion)JVar9.tag;
        pJVar8[1] = local_138;
      }
    }
    else {
      pJVar8->float64 = 0.0;
      if (((in_R9D & 0x800) != 0) &&
         (val_02.tag._0_4_ = in_stack_00000010, val_02.u.ptr = (void *)in_stack_00000008,
         val_02.tag._4_4_ = in_stack_00000014, iVar6 = JS_IsFunction(in_RDI,val_02), iVar6 != 0)) {
        v_02.tag._0_4_ = in_stack_00000010;
        v_02.u.ptr = (void *)in_stack_00000008;
        v_02.tag._4_4_ = in_stack_00000014;
        JVar9 = JS_DupValue(in_RDI,v_02);
        local_120 = JVar9.u;
        *pJVar8 = local_120;
      }
      pJVar8[1].float64 = 0.0;
      if (((in_R9D & 0x1000) != 0) &&
         (val_03.tag._0_4_ = in_stack_00000020, val_03.u.ptr = (void *)in_stack_00000018,
         val_03.tag._4_4_ = in_stack_00000024, iVar6 = JS_IsFunction(in_RDI,val_03), iVar6 != 0)) {
        v_03.tag._0_4_ = in_stack_00000020;
        v_03.u.ptr = (void *)in_stack_00000018;
        v_03.tag._4_4_ = in_stack_00000024;
        JVar9 = JS_DupValue(in_RDI,v_03);
        local_130 = JVar9.u;
        pJVar8[1] = local_130;
      }
    }
    return 1;
  }
LAB_0012fd7d:
  iVar6 = JS_ThrowTypeErrorOrFalse(in_RDI,(int)(ulong)in_R9D,"object is not extensible");
  return iVar6;
}

Assistant:

static int JS_CreateProperty(JSContext *ctx, JSObject *p,
                             JSAtom prop, JSValueConst val,
                             JSValueConst getter, JSValueConst setter,
                             int flags)
{
    JSProperty *pr;
    int ret, prop_flags;

    /* add a new property or modify an existing exotic one */
    if (p->is_exotic) {
        if (p->class_id == JS_CLASS_ARRAY) {
            uint32_t idx, len;

            if (p->fast_array) {
                if (__JS_AtomIsTaggedInt(prop)) {
                    idx = __JS_AtomToUInt32(prop);
                    if (idx == p->u.array.count) {
                        if (!p->extensible)
                            goto not_extensible;
                        if (flags & (JS_PROP_HAS_GET | JS_PROP_HAS_SET))
                            goto convert_to_array;
                        prop_flags = get_prop_flags(flags, 0);
                        if (prop_flags != JS_PROP_C_W_E)
                            goto convert_to_array;
                        return add_fast_array_element(ctx, p,
                                                      JS_DupValue(ctx, val), flags);
                    } else {
                        goto convert_to_array;
                    }
                } else if (JS_AtomIsArrayIndex(ctx, &idx, prop)) {
                    /* convert the fast array to normal array */
                convert_to_array:
                    if (convert_fast_array_to_array(ctx, p))
                        return -1;
                    goto generic_array;
                }
            } else if (JS_AtomIsArrayIndex(ctx, &idx, prop)) {
                JSProperty *plen;
                JSShapeProperty *pslen;
            generic_array:
                /* update the length field */
                plen = &p->prop[0];
                JS_ToUint32(ctx, &len, plen->u.value);
                if ((idx + 1) > len) {
                    pslen = get_shape_prop(p->shape);
                    if (unlikely(!(pslen->flags & JS_PROP_WRITABLE)))
                        return JS_ThrowTypeErrorReadOnly(ctx, flags, JS_ATOM_length);
                    /* XXX: should update the length after defining
                       the property */
                    len = idx + 1;
                    set_value(ctx, &plen->u.value, JS_NewUint32(ctx, len));
                }
            }
        } else if (p->class_id >= JS_CLASS_UINT8C_ARRAY &&
                   p->class_id <= JS_CLASS_FLOAT64_ARRAY) {
            ret = JS_AtomIsNumericIndex(ctx, prop);
            if (ret != 0) {
                if (ret < 0)
                    return -1;
                return JS_ThrowTypeErrorOrFalse(ctx, flags, "cannot create numeric index in typed array");
            }
        } else if (!(flags & JS_PROP_NO_EXOTIC)) {
            const JSClassExoticMethods *em = ctx->rt->class_array[p->class_id].exotic;
            if (em) {
                if (em->define_own_property) {
                    return em->define_own_property(ctx, JS_MKPTR(JS_TAG_OBJECT, p),
                                                   prop, val, getter, setter, flags);
                }
                ret = JS_IsExtensible(ctx, JS_MKPTR(JS_TAG_OBJECT, p));
                if (ret < 0)
                    return -1;
                if (!ret)
                    goto not_extensible;
            }
        }
    }

    if (!p->extensible) {
    not_extensible:
        return JS_ThrowTypeErrorOrFalse(ctx, flags, "object is not extensible");
    }

    if (flags & (JS_PROP_HAS_GET | JS_PROP_HAS_SET)) {
        prop_flags = (flags & (JS_PROP_CONFIGURABLE | JS_PROP_ENUMERABLE)) |
            JS_PROP_GETSET;
    } else {
        prop_flags = flags & JS_PROP_C_W_E;
    }
    pr = add_property(ctx, p, prop, prop_flags);
    if (unlikely(!pr))
        return -1;
    if (flags & (JS_PROP_HAS_GET | JS_PROP_HAS_SET)) {
        pr->u.getset.getter = NULL;
        if ((flags & JS_PROP_HAS_GET) && JS_IsFunction(ctx, getter)) {
            pr->u.getset.getter =
                JS_VALUE_GET_OBJ(JS_DupValue(ctx, getter));
        }
        pr->u.getset.setter = NULL;
        if ((flags & JS_PROP_HAS_SET) && JS_IsFunction(ctx, setter)) {
            pr->u.getset.setter =
                JS_VALUE_GET_OBJ(JS_DupValue(ctx, setter));
        }
    } else {
        if (flags & JS_PROP_HAS_VALUE) {
            pr->u.value = JS_DupValue(ctx, val);
        } else {
            pr->u.value = JS_UNDEFINED;
        }
    }
    return TRUE;
}